

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall
Catch::StreamBufImpl<Catch::OutputDebugWriter,_256UL>::overflow
          (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this,int c)

{
  char __c;
  long lVar1;
  long lVar2;
  allocator<char> local_39;
  string local_38;
  int local_14;
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *pSStack_10;
  int c_local;
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this_local;
  
  local_14 = c;
  pSStack_10 = this;
  (**(code **)(*(long *)&this->super_StreamBufBase + 0x30))();
  if (local_14 != -1) {
    lVar1 = std::streambuf::pbase();
    lVar2 = std::streambuf::epptr();
    if (lVar1 == lVar2) {
      __c = (char)local_14;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,1,__c,&local_39);
      OutputDebugWriter::operator()((OutputDebugWriter *)&this->field_0x140,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
    }
    else {
      std::streambuf::sputc((char)this);
    }
  }
  return 0;
}

Assistant:

int	overflow( int c ) {
            sync();

            if( c != EOF ) {
                if( pbase() == epptr() )
                    m_writer( std::string( 1, static_cast<char>( c ) ) );
                else
                    sputc( static_cast<char>( c ) );
            }
            return 0;
        }